

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
::find_non_soo<std::pair<void_const*,void_const*>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
           *this,key_arg<std::pair<const_void_*,_const_void_*>_> *key,size_t hash)

{
  int *piVar1;
  char *pcVar2;
  long lVar3;
  undefined1 auVar4 [16];
  uint32_t uVar5;
  int iVar6;
  ulong extraout_RDX;
  ulong uVar7;
  ushort x;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i match;
  undefined1 auVar12 [16];
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar14 [16];
  iterator iVar30;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_60;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  undefined1 local_38 [16];
  
  probe(&local_60,(CommonFields *)this,hash);
  lVar3 = *(long *)(this + 0x10);
  auVar9 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar9 = pshuflw(auVar9,auVar9,0);
  uVar8 = auVar9._0_4_;
  auVar9._4_4_ = uVar8;
  auVar9._0_4_ = uVar8;
  auVar9._8_4_ = uVar8;
  auVar9._12_4_ = uVar8;
  while( true ) {
    pcVar2 = (char *)(lVar3 + local_60.offset_);
    auVar10[0] = -(auVar9[0] == *pcVar2);
    auVar10[1] = -(auVar9[1] == pcVar2[1]);
    auVar10[2] = -(auVar9[2] == pcVar2[2]);
    auVar10[3] = -(auVar9[3] == pcVar2[3]);
    auVar10[4] = -(auVar9[4] == pcVar2[4]);
    auVar10[5] = -(auVar9[5] == pcVar2[5]);
    auVar10[6] = -(auVar9[6] == pcVar2[6]);
    auVar10[7] = -(auVar9[7] == pcVar2[7]);
    auVar10[8] = -(auVar9[8] == pcVar2[8]);
    auVar10[9] = -(auVar9[9] == pcVar2[9]);
    auVar10[10] = -(auVar9[10] == pcVar2[10]);
    auVar10[0xb] = -(auVar9[0xb] == pcVar2[0xb]);
    auVar10[0xc] = -(auVar9[0xc] == pcVar2[0xc]);
    auVar10[0xd] = -(auVar9[0xd] == pcVar2[0xd]);
    auVar10[0xe] = -(auVar9[0xe] == pcVar2[0xe]);
    auVar10[0xf] = -(auVar9[0xf] == pcVar2[0xf]);
    cVar13 = *pcVar2;
    cVar15 = pcVar2[1];
    cVar16 = pcVar2[2];
    cVar17 = pcVar2[3];
    cVar18 = pcVar2[4];
    cVar19 = pcVar2[5];
    cVar20 = pcVar2[6];
    cVar21 = pcVar2[7];
    cVar22 = pcVar2[8];
    cVar23 = pcVar2[9];
    cVar24 = pcVar2[10];
    cVar25 = pcVar2[0xb];
    cVar26 = pcVar2[0xc];
    cVar27 = pcVar2[0xd];
    cVar28 = pcVar2[0xe];
    cVar29 = pcVar2[0xf];
    for (x = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf;
        x != 0; x = x - 1 & x) {
      local_48 = cVar13;
      cStack_47 = cVar15;
      cStack_46 = cVar16;
      cStack_45 = cVar17;
      cStack_44 = cVar18;
      cStack_43 = cVar19;
      cStack_42 = cVar20;
      cStack_41 = cVar21;
      cStack_40 = cVar22;
      cStack_3f = cVar23;
      cStack_3e = cVar24;
      cStack_3d = cVar25;
      cStack_3c = cVar26;
      cStack_3b = cVar27;
      cStack_3a = cVar28;
      cStack_39 = cVar29;
      local_38 = auVar9;
      uVar5 = TrailingZeros<unsigned_short>(x);
      uVar7 = uVar5 + local_60.offset_ & local_60.mask_;
      piVar1 = (int *)(*(long *)(this + 0x18) + uVar7 * 0x18);
      auVar12._0_4_ = -(uint)(*(int *)&key->first == *piVar1);
      auVar12._4_4_ = -(uint)(*(int *)((long)&key->first + 4) == piVar1[1]);
      auVar12._8_4_ = -(uint)(*(int *)&key->second == piVar1[2]);
      auVar12._12_4_ = -(uint)(*(int *)((long)&key->second + 4) == piVar1[3]);
      auVar11._4_4_ = auVar12._0_4_;
      auVar11._0_4_ = auVar12._4_4_;
      auVar11._8_4_ = auVar12._12_4_;
      auVar11._12_4_ = auVar12._8_4_;
      iVar6 = movmskpd((int)*(long *)(this + 0x18),auVar11 & auVar12);
      if (iVar6 == 3) {
        iVar30 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                                *)this,uVar7);
        return iVar30;
      }
      auVar9 = local_38;
      cVar13 = local_48;
      cVar15 = cStack_47;
      cVar16 = cStack_46;
      cVar17 = cStack_45;
      cVar18 = cStack_44;
      cVar19 = cStack_43;
      cVar20 = cStack_42;
      cVar21 = cStack_41;
      cVar22 = cStack_40;
      cVar23 = cStack_3f;
      cVar24 = cStack_3e;
      cVar25 = cStack_3d;
      cVar26 = cStack_3c;
      cVar27 = cStack_3b;
      cVar28 = cStack_3a;
      cVar29 = cStack_39;
    }
    auVar14[0] = -(cVar13 == -0x80);
    auVar14[1] = -(cVar15 == -0x80);
    auVar14[2] = -(cVar16 == -0x80);
    auVar14[3] = -(cVar17 == -0x80);
    auVar14[4] = -(cVar18 == -0x80);
    auVar14[5] = -(cVar19 == -0x80);
    auVar14[6] = -(cVar20 == -0x80);
    auVar14[7] = -(cVar21 == -0x80);
    auVar14[8] = -(cVar22 == -0x80);
    auVar14[9] = -(cVar23 == -0x80);
    auVar14[10] = -(cVar24 == -0x80);
    auVar14[0xb] = -(cVar25 == -0x80);
    auVar14[0xc] = -(cVar26 == -0x80);
    auVar14[0xd] = -(cVar27 == -0x80);
    auVar14[0xe] = -(cVar28 == -0x80);
    auVar14[0xf] = -(cVar29 == -0x80);
    if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar14 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar14 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar14 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar14 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar14 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar14 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar14 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar14 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar14 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar14 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar14 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar14 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar14 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar14 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar29 == -0x80)
    break;
    uVar7 = local_60.index_ + 0x10;
    local_60.offset_ = local_60.offset_ + local_60.index_ + 0x10 & local_60.mask_;
    local_60.index_ = uVar7;
    if (*(ulong *)this < uVar7) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>, K = std::pair<const void *, const void *>]"
                   );
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
              *)this);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = extraout_RDX;
  return (iterator)(auVar4 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }